

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

LabelInstr * __thiscall
Lowerer::LowerGeneratorHelper::InsertBailOutForElidedYield(LowerGeneratorHelper *this)

{
  Instr *this_00;
  anon_class_16_2_5fa6de45 fn;
  RegNum reg;
  Instr *instr;
  LabelInstr *branchTarget;
  BranchInstr *instr_00;
  RegOpnd *opndArg;
  RegOpnd *frameRegOpnd;
  Instr *branchToEpilogue;
  Instr *bailOutCall;
  Instr *insertionPoint;
  LabelInstr *local_18;
  LabelInstr *bailOutNoSaveLabel;
  LowerGeneratorHelper *this_local;
  
  local_18 = (LabelInstr *)0x0;
  fn.bailOutNoSaveLabel = &local_18;
  fn.this = this;
  bailOutNoSaveLabel = (LabelInstr *)this;
  Func::
  MapUntilYieldOffsetResumeLabels<Lowerer::LowerGeneratorHelper::InsertBailOutForElidedYield()::__0>
            (this->func,fn);
  if (local_18 != (LabelInstr *)0x0) {
    local_18->field_0x78 = local_18->field_0x78 & 0xfb | 4;
    this_00 = this->func->m_bailOutForElidedYieldInsertionPoint->m_next;
    instr = IR::Instr::New(Call,this->func);
    branchTarget = GetEpilogueForBailOut(this);
    instr_00 = IR::BranchInstr::New(JMP,branchTarget,this->func);
    IR::Instr::InsertBefore(this_00,&local_18->super_Instr);
    IR::Instr::InsertBefore(this_00,instr);
    IR::Instr::InsertBefore(this_00,&instr_00->super_Instr);
    reg = LowererMD::GetRegFramePointer();
    opndArg = IR::RegOpnd::New((StackSym *)0x0,reg,TyUint64,this->func);
    LowererMD::LoadHelperArgument(this->lowererMD,instr,&opndArg->super_Opnd);
    LowererMD::ChangeToHelperCall
              (this->lowererMD,instr,HelperNoSaveRegistersBailOutForElidedYield,(LabelInstr *)0x0,
               (Opnd *)0x0,(PropertySymOpnd *)0x0,false);
    local_18->m_name = L"GeneratorBailOutForElidedYield";
  }
  return local_18;
}

Assistant:

IR::LabelInstr*
Lowerer::LowerGeneratorHelper::InsertBailOutForElidedYield()
{
    IR::LabelInstr* bailOutNoSaveLabel = nullptr;

    this->func->MapUntilYieldOffsetResumeLabels([this, &bailOutNoSaveLabel](int, const YieldOffsetResumeLabel& yorl)
    {
        if (yorl.Second() == nullptr)
        {
            if (bailOutNoSaveLabel == nullptr)
            {
                bailOutNoSaveLabel = IR::LabelInstr::New(Js::OpCode::Label, this->func);
            }

            return true;
        }

        return false;
    });

    // Insert the bailoutnosave label somewhere along with a call to BailOutNoSave helper
    if (bailOutNoSaveLabel != nullptr)
    {
        bailOutNoSaveLabel->m_hasNonBranchRef = true;

        IR::Instr* insertionPoint = this->func->m_bailOutForElidedYieldInsertionPoint->m_next;
        IR::Instr* bailOutCall = IR::Instr::New(Js::OpCode::Call, this->func);
        IR::Instr* branchToEpilogue = IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, this->GetEpilogueForBailOut(), this->func);

        insertionPoint->InsertBefore(bailOutNoSaveLabel);
        insertionPoint->InsertBefore(bailOutCall);
        insertionPoint->InsertBefore(branchToEpilogue);

        IR::RegOpnd* frameRegOpnd = IR::RegOpnd::New(nullptr, LowererMD::GetRegFramePointer(), TyMachPtr, this->func);
        this->lowererMD.LoadHelperArgument(bailOutCall, frameRegOpnd);
        this->lowererMD.ChangeToHelperCall(bailOutCall, IR::HelperNoSaveRegistersBailOutForElidedYield);

        LABELNAMESET(bailOutNoSaveLabel, "GeneratorBailOutForElidedYield");
    }

    return bailOutNoSaveLabel;
}